

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option-parser.cc
# Opt level: O2

void __thiscall
wabt::OptionParser::AddOption(OptionParser *this,char *long_name,char *help,NullCallback *callback)

{
  function<void_()> *this_00;
  undefined1 local_158 [8];
  Option option;
  string local_a8;
  string local_88;
  function<void_()> local_68;
  _Any_data local_48;
  code *local_38;
  code *pcStack_30;
  allocator local_22;
  allocator local_21;
  
  std::__cxx11::string::string((string *)&option.callback._M_invoker,long_name,&local_22);
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  local_a8._M_string_length = 0;
  local_a8.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&local_88,help,&local_21);
  std::function<void_()>::function(&local_68,callback);
  local_38 = (code *)0x0;
  pcStack_30 = (code *)0x0;
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  this_00 = (function<void_()> *)operator_new(0x20);
  std::function<void_()>::function(this_00,&local_68);
  pcStack_30 = std::
               _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/option-parser.cc:78:17)>
               ::_M_invoke;
  local_38 = std::
             _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/option-parser.cc:78:17)>
             ::_M_manager;
  local_48._M_unused._M_object = this_00;
  Option::Option((Option *)local_158,'\0',(string *)&option.callback._M_invoker,&local_a8,No,
                 &local_88,(Callback *)&local_48);
  std::_Function_base::~_Function_base((_Function_base *)&local_48);
  std::_Function_base::~_Function_base(&local_68.super__Function_base);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&option.callback._M_invoker);
  std::vector<wabt::OptionParser::Option,std::allocator<wabt::OptionParser::Option>>::
  emplace_back<wabt::OptionParser::Option_const&>
            ((vector<wabt::OptionParser::Option,std::allocator<wabt::OptionParser::Option>> *)
             &this->options_,(Option *)local_158);
  Option::~Option((Option *)local_158);
  return;
}

Assistant:

void OptionParser::AddOption(const char* long_name,
                             const char* help,
                             const NullCallback& callback) {
  Option option('\0', long_name, std::string(), HasArgument::No, help,
                [callback](const char*) { callback(); });
  AddOption(option);
}